

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryBasicGeometryShaderTests.cpp
# Opt level: O2

void __thiscall
vkt::geometry::anon_unknown_0::VaryingOutputCountTestInstance::bindDescriptorSets
          (VaryingOutputCountTestInstance *this,DeviceInterface *vk,VkDevice device,
          Allocator *memAlloc,VkCommandBuffer *cmdBuffer,VkPipelineLayout *pipelineLayout)

{
  deInt32 dVar1;
  Allocation *pAVar2;
  undefined8 *puVar3;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data;
  VkResult result;
  VkSharingMode VVar4;
  DescriptorSetUpdateBuilder *pDVar5;
  VkSamplerCreateInfo *this_00;
  undefined8 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  VkDescriptorBufferInfo bufferDescriptorInfo;
  pointer pVStack_140;
  VkDescriptorImageInfo descriptorImageInfo;
  VkAllocationCallbacks *pVStack_f0;
  Location local_e8;
  TextureFormat texFormat;
  VkSamplerCreateInfo samplerParams;
  VkBufferCreateInfo bufferCreateInfo;
  
  if (this->m_test == READ_TEXTURE) {
    texFormat = glu::mapGLInternalFormat(0x8058);
    VVar4 = ::vk::mapTextureFormat(&texFormat);
    samplerParams.pNext = (void *)0x0;
    samplerParams.compareEnable = 0;
    samplerParams.compareOp = VK_COMPARE_OP_NEVER;
    samplerParams.minLod = 0.0;
    samplerParams.maxLod = 0.0;
    samplerParams.borderColor = VK_BORDER_COLOR_FLOAT_TRANSPARENT_BLACK;
    samplerParams.unnormalizedCoordinates = 0;
    samplerParams.flags = 0;
    samplerParams.magFilter = VK_FILTER_NEAREST;
    samplerParams.minFilter = VK_FILTER_NEAREST;
    samplerParams.mipmapMode = VK_SAMPLER_MIPMAP_MODE_NEAREST;
    samplerParams.sType = VK_STRUCTURE_TYPE_SAMPLER_CREATE_INFO;
    samplerParams._4_4_ = 0;
    samplerParams._32_8_ = &DAT_200000002;
    samplerParams.addressModeW = VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE;
    samplerParams.mipLodBias = 0.0;
    samplerParams.anisotropyEnable = 0;
    samplerParams.maxAnisotropy = 1.0;
    ::vk::createSampler((Move<vk::Handle<(vk::HandleType)20>_> *)&bufferDescriptorInfo,vk,device,
                        &samplerParams,(VkAllocationCallbacks *)0x0);
    bufferCreateInfo._16_8_ = bufferDescriptorInfo.range;
    bufferCreateInfo.size = (VkDeviceSize)pVStack_140;
    bufferCreateInfo._0_8_ = bufferDescriptorInfo.buffer.m_internal;
    bufferCreateInfo.pNext = (void *)bufferDescriptorInfo.offset;
    bufferDescriptorInfo.buffer.m_internal = 0;
    bufferDescriptorInfo.offset = 0;
    bufferDescriptorInfo.range = 0;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)20>_>::reset
              (&(this->m_sampler).super_RefBase<vk::Handle<(vk::HandleType)20>_>);
    (this->m_sampler).super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_device =
         (VkDevice)bufferCreateInfo._16_8_;
    (this->m_sampler).super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)bufferCreateInfo.size;
    (this->m_sampler).super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.object.m_internal =
         bufferCreateInfo._0_8_;
    (this->m_sampler).super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)bufferCreateInfo.pNext;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)20>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)20>_> *)&bufferDescriptorInfo);
    bufferCreateInfo.sType = VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
    bufferCreateInfo.pNext = (void *)0x0;
    bufferCreateInfo._16_8_ = bufferCreateInfo._16_8_ & 0xffffffff00000000;
    bufferCreateInfo.size =
         (this->m_texture).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
    bufferCreateInfo.usage = 1;
    bufferCreateInfo.queueFamilyIndexCount = 3;
    bufferCreateInfo._44_4_ = 4;
    bufferCreateInfo.pQueueFamilyIndices = (deUint32 *)0x600000005;
    bufferCreateInfo.sharingMode = VVar4;
    ::vk::createImageView
              ((Move<vk::Handle<(vk::HandleType)13>_> *)&descriptorImageInfo,vk,device,
               (VkImageViewCreateInfo *)&bufferCreateInfo,(VkAllocationCallbacks *)0x0);
    bufferDescriptorInfo.range = descriptorImageInfo._16_8_;
    bufferDescriptorInfo.buffer.m_internal = descriptorImageInfo.sampler.m_internal;
    bufferDescriptorInfo.offset = descriptorImageInfo.imageView.m_internal;
    descriptorImageInfo.sampler.m_internal = 0;
    descriptorImageInfo.imageView.m_internal = 0;
    descriptorImageInfo.imageLayout = VK_IMAGE_LAYOUT_UNDEFINED;
    descriptorImageInfo._20_4_ = 0;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::reset
              (&(this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>);
    (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
         (VkDevice)bufferDescriptorInfo.range;
    (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
         pVStack_f0;
    (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal =
         bufferDescriptorInfo.buffer.m_internal;
    (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface
         = (DeviceInterface *)bufferDescriptorInfo.offset;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)13>_> *)&descriptorImageInfo);
    descriptorImageInfo.imageView.m_internal =
         (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal
    ;
    descriptorImageInfo.sampler.m_internal =
         (this->m_sampler).super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.object.m_internal;
    descriptorImageInfo.imageLayout = VK_IMAGE_LAYOUT_GENERAL;
    ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
              ((DescriptorSetUpdateBuilder *)&bufferDescriptorInfo);
    local_e8.m_binding = 0;
    local_e8.m_arrayElement = 0;
    pDVar5 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                       ((DescriptorSetUpdateBuilder *)&bufferDescriptorInfo,
                        (VkDescriptorSet)
                        (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.
                        m_data.object.m_internal,&local_e8,VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER
                        ,&descriptorImageInfo);
    ::vk::DescriptorSetUpdateBuilder::update(pDVar5,vk,device);
    this_00 = (VkSamplerCreateInfo *)&bufferDescriptorInfo;
  }
  else {
    if (this->m_test != READ_UNIFORM) {
      return;
    }
    dVar1 = this->m_maxEmitCount;
    makeBufferCreateInfo(&bufferCreateInfo,0x10,0x10);
    ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&bufferDescriptorInfo,vk,device,
                       &bufferCreateInfo,(VkAllocationCallbacks *)0x0);
    samplerParams.flags = (undefined4)bufferDescriptorInfo.range;
    samplerParams.magFilter = bufferDescriptorInfo.range._4_4_;
    samplerParams._24_8_ = pVStack_140;
    samplerParams._0_8_ = bufferDescriptorInfo.buffer.m_internal;
    samplerParams.pNext = (void *)bufferDescriptorInfo.offset;
    bufferDescriptorInfo.buffer.m_internal = 0;
    bufferDescriptorInfo.offset = 0;
    bufferDescriptorInfo.range = 0;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::reset
              (&(this->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
    (this->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
         (VkDevice)samplerParams._16_8_;
    (this->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)samplerParams._24_8_;
    (this->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
         samplerParams._0_8_;
    (this->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)samplerParams.pNext;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)8>_> *)&bufferDescriptorInfo);
    ::vk::getBufferMemoryRequirements
              ((VkMemoryRequirements *)&samplerParams,vk,device,
               (VkBuffer)
               (this->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
    (*memAlloc->_vptr_Allocator[3])(&bufferDescriptorInfo,memAlloc,&samplerParams,1);
    bufferDescriptorInfo.buffer.m_internal = 0;
    data._8_4_ = in_stack_fffffffffffffe80;
    data.ptr = (Allocation *)in_stack_fffffffffffffe78;
    data._12_4_ = in_stack_fffffffffffffe84;
    de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::assignData
              (&(this->m_allocation).
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>,data);
    de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
              ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
               &bufferDescriptorInfo);
    pAVar2 = (this->m_allocation).
             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
    result = (*vk->_vptr_DeviceInterface[0xc])
                       (vk,device,
                        (this->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object
                        .m_internal,(pAVar2->m_memory).m_internal,pAVar2->m_offset);
    ::vk::checkResult(result,
                      "vk.bindBufferMemory(device, *m_buffer, m_allocation->getMemory(), m_allocation->getOffset())"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/geometry/vktGeometryBasicGeometryShaderTests.cpp"
                      ,0x1b4);
    puVar3 = (undefined8 *)
             ((this->m_allocation).
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_hostPtr;
    *puVar3 = 6;
    *(deInt32 *)(puVar3 + 1) = dVar1;
    *(undefined4 *)((long)puVar3 + 0xc) = 10;
    pAVar2 = (this->m_allocation).
             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
    ::vk::flushMappedMemoryRange
              (vk,device,(VkDeviceMemory)(pAVar2->m_memory).m_internal,pAVar2->m_offset,0x10);
    bufferDescriptorInfo.buffer.m_internal =
         (this->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
    bufferDescriptorInfo.offset = 0;
    bufferDescriptorInfo.range = 0x10;
    ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
              ((DescriptorSetUpdateBuilder *)&samplerParams);
    descriptorImageInfo.sampler.m_internal = 0;
    pDVar5 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                       ((DescriptorSetUpdateBuilder *)&samplerParams,
                        (VkDescriptorSet)
                        (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.
                        m_data.object.m_internal,(Location *)&descriptorImageInfo,
                        VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,&bufferDescriptorInfo);
    ::vk::DescriptorSetUpdateBuilder::update(pDVar5,vk,device);
    this_00 = &samplerParams;
  }
  ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)this_00);
  (*vk->_vptr_DeviceInterface[0x56])
            (vk,*cmdBuffer,0,pipelineLayout->m_internal,0,1,&this->m_descriptorSet,0,0);
  return;
}

Assistant:

void VaryingOutputCountTestInstance::bindDescriptorSets (const DeviceInterface& vk, const VkDevice device, Allocator& memAlloc,
														 const VkCommandBuffer& cmdBuffer, const VkPipelineLayout& pipelineLayout)
{
	if (m_test == READ_UNIFORM)
	{
		const deInt32				emitCount[4]		= { 6, 0, m_maxEmitCount, 10 };
		const VkBufferCreateInfo	bufferCreateInfo	= makeBufferCreateInfo(sizeof(emitCount), VK_BUFFER_USAGE_UNIFORM_BUFFER_BIT);
		m_buffer										= createBuffer(vk, device, &bufferCreateInfo);
		m_allocation									= memAlloc.allocate(getBufferMemoryRequirements(vk, device, *m_buffer), MemoryRequirement::HostVisible);

		VK_CHECK(vk.bindBufferMemory(device, *m_buffer, m_allocation->getMemory(), m_allocation->getOffset()));
		{
			deMemcpy(m_allocation->getHostPtr(), &emitCount[0], sizeof(emitCount));
			flushMappedMemoryRange(vk, device, m_allocation->getMemory(), m_allocation->getOffset(), sizeof(emitCount));

			const VkDescriptorBufferInfo bufferDescriptorInfo = makeDescriptorBufferInfo(*m_buffer, 0ull, sizeof(emitCount));

			DescriptorSetUpdateBuilder()
				.writeSingle(*m_descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, &bufferDescriptorInfo)
				.update(vk, device);
			vk.cmdBindDescriptorSets(cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, pipelineLayout, 0u, 1u, &*m_descriptorSet, 0u, DE_NULL);
		}
	}
	else if (m_test == READ_TEXTURE)
	{
		const tcu::TextureFormat	texFormat			= glu::mapGLInternalFormat(GL_RGBA8);
		const VkFormat				format				= mapTextureFormat(texFormat);
		const VkSamplerCreateInfo	samplerParams		=
														{
															VK_STRUCTURE_TYPE_SAMPLER_CREATE_INFO,		// VkStructureType			sType;
															DE_NULL,									// const void*				pNext;
															0u,											// VkSamplerCreateFlags		flags;
															VK_FILTER_NEAREST,							// VkFilter					magFilter;
															VK_FILTER_NEAREST,							// VkFilter					minFilter;
															VK_SAMPLER_MIPMAP_MODE_NEAREST,				// VkSamplerMipmapMode		mipmapMode;
															VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE,		// VkSamplerAddressMode		addressModeU;
															VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE,		// VkSamplerAddressMode		addressModeV;
															VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE,		// VkSamplerAddressMode		addressModeW;
															0.0f,										// float					mipLodBias;
															VK_FALSE,									// VkBool32					anisotropyEnable;
															1.0f,										// float					maxAnisotropy;
															false,										// VkBool32					compareEnable;
															VK_COMPARE_OP_NEVER,						// VkCompareOp				compareOp;
															0.0f,										// float					minLod;
															0.0f,										// float					maxLod;
															VK_BORDER_COLOR_FLOAT_TRANSPARENT_BLACK,	// VkBorderColor			borderColor;
															false										// VkBool32					unnormalizedCoordinates;
														};
		m_sampler										= createSampler(vk, device, &samplerParams);
		const VkImageViewCreateInfo	viewParams			=
														{
															VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO,	// VkStructureType			sType;
															NULL,										// const voide*				pNext;
															0u,											// VkImageViewCreateFlags	flags;
															*m_texture,									// VkImage					image;
															VK_IMAGE_VIEW_TYPE_2D,						// VkImageViewType			viewType;
															format,										// VkFormat					format;
															makeComponentMappingRGBA(),					// VkChannelMapping			channels;
															{
																VK_IMAGE_ASPECT_COLOR_BIT,				// VkImageAspectFlags	aspectMask;
																0u,										// deUint32				baseMipLevel;
																1u,										// deUint32				mipLevels;
																0,										// deUint32				baseArraySlice;
																1u										// deUint32				arraySize;
															},											// VkImageSubresourceRange	subresourceRange;
														};
		m_imageView										= createImageView(vk, device, &viewParams);
		const VkDescriptorImageInfo descriptorImageInfo = makeDescriptorImageInfo (*m_sampler, *m_imageView, VK_IMAGE_LAYOUT_GENERAL);
		DescriptorSetUpdateBuilder()
			.writeSingle(*m_descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER, &descriptorImageInfo)
			.update(vk, device);
		vk.cmdBindDescriptorSets(cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, pipelineLayout, 0u, 1u, &*m_descriptorSet, 0u, DE_NULL);
	}
}